

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O0

int ASN1_STRING_set(ASN1_STRING *str,void *_data,ossl_ssize_t len_s)

{
  uchar *orig_ptr;
  uchar *puVar1;
  uchar *c;
  size_t len;
  char *data;
  ossl_ssize_t len_s_local;
  void *_data_local;
  ASN1_STRING *str_local;
  
  c = (uchar *)len_s;
  if (len_s < 0) {
    if (_data == (void *)0x0) {
      return 0;
    }
    c = (uchar *)strlen((char *)_data);
  }
  if (c < (uchar *)0x4000001) {
    if ((str->length <= (int)c) || (str->data == (uchar *)0x0)) {
      orig_ptr = str->data;
      if (orig_ptr == (uchar *)0x0) {
        puVar1 = (uchar *)OPENSSL_malloc((size_t)(c + 1));
        str->data = puVar1;
      }
      else {
        puVar1 = (uchar *)OPENSSL_realloc(orig_ptr,(size_t)(c + 1));
        str->data = puVar1;
      }
      if (str->data == (uchar *)0x0) {
        str->data = orig_ptr;
        return 0;
      }
    }
    str->length = (int)c;
    if (_data != (void *)0x0) {
      OPENSSL_memcpy(str->data,_data,(size_t)c);
      str->data[(long)c] = '\0';
    }
    str_local._4_4_ = 1;
  }
  else {
    ERR_put_error(0xc,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_lib.cc"
                  ,0xf5);
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

int ASN1_STRING_set(ASN1_STRING *str, const void *_data, ossl_ssize_t len_s) {
  const char *data = reinterpret_cast<const char *>(_data);
  size_t len;
  if (len_s < 0) {
    if (data == NULL) {
      return 0;
    }
    len = strlen(data);
  } else {
    len = (size_t)len_s;
  }

  static_assert(ASN1_STRING_MAX < INT_MAX, "len will not overflow int");
  if (len > ASN1_STRING_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_OVERFLOW);
    return 0;
  }

  if (str->length <= (int)len || str->data == NULL) {
    unsigned char *c = str->data;
    if (c == NULL) {
      str->data = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len + 1));
    } else {
      str->data = reinterpret_cast<uint8_t *>(OPENSSL_realloc(c, len + 1));
    }

    if (str->data == NULL) {
      str->data = c;
      return 0;
    }
  }
  str->length = (int)len;
  if (data != NULL) {
    OPENSSL_memcpy(str->data, data, len);
    // Historically, OpenSSL would NUL-terminate most (but not all)
    // |ASN1_STRING|s, in case anyone accidentally passed |str->data| into a
    // function expecting a C string. We retain this behavior for compatibility,
    // but code must not rely on this. See CVE-2021-3712.
    str->data[len] = '\0';
  }
  return 1;
}